

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadF64(BinaryReader *this,uint64_t *out_value,char *desc)

{
  Offset *pOVar1;
  Offset OVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  
  OVar2 = (this->state_).offset;
  if (this->read_end_ < OVar2 + 8) {
    PrintError(this,"unable to read %s: %s","double","f64.const value",in_R8,in_R9,OVar2);
    return (Result)Error;
  }
  *out_value = *(uint64_t *)((this->state_).data + OVar2);
  pOVar1 = &(this->state_).offset;
  *pOVar1 = *pOVar1 + 8;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadT(T* out_value,
                           const char* type_name,
                           const char* desc) {
  if (state_.offset + sizeof(T) > read_end_) {
    PrintError("unable to read %s: %s", type_name, desc);
    return Result::Error;
  }
#if WABT_BIG_ENDIAN
  uint8_t tmp[sizeof(T)];
  memcpy(tmp, state_.data + state_.offset, sizeof(tmp));
  SwapBytesSized(tmp, sizeof(tmp));
  memcpy(out_value, tmp, sizeof(T));
#else
  memcpy(out_value, state_.data + state_.offset, sizeof(T));
#endif
  state_.offset += sizeof(T);
  return Result::Ok;
}